

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UBool utf8TextAccess(UText *ut,int64_t index,UBool forward)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint8_t *puVar16;
  uint *puVar17;
  uint *puVar18;
  char cVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  uint local_90;
  uint local_8c;
  uint *local_88;
  undefined8 local_80;
  uint8_t *local_78;
  UText *local_70;
  UChar *local_68;
  undefined8 local_60;
  ulong local_58;
  uint local_4c;
  long local_48;
  void *local_40;
  uint *local_38;
  
  local_78 = (uint8_t *)ut->context;
  local_8c = ut->b;
  uVar20 = 0x7fffffff;
  if ((ulong)index < 0x7fffffff) {
    uVar20 = index;
  }
  uVar20 = uVar20 & 0xffffffff;
  if (index < 0) {
    uVar20 = 0;
  }
  if ((int)local_8c < (int)uVar20) {
    if ((int)local_8c < 0) {
      uVar9 = (ulong)ut->c;
      if (ut->c <= (int)uVar20) {
        lVar15 = uVar9 << 0x20;
        for (; uVar5 = uVar20, uVar6 = uVar20, (long)uVar9 < (long)uVar20; uVar9 = uVar9 + 1) {
          if (local_78[uVar9] == '\0') {
            uVar5 = uVar9;
            uVar6 = lVar15 >> 0x20;
            break;
          }
          ut->c = (int)uVar9 + 1;
          lVar15 = lVar15 + 0x100000000;
        }
        if (local_78[uVar6] == '\0') {
          local_8c = (uint)uVar5;
          ut->b = local_8c;
          *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
          uVar20 = uVar5 & 0xffffffff;
        }
      }
    }
    else {
      uVar20 = (ulong)local_8c;
    }
  }
  uVar3 = (uint)uVar20;
  local_48 = (long)(int)uVar3;
  local_70 = ut;
  if (forward == '\0') {
    if (ut->chunkNativeStart == local_48) {
      if (uVar3 == 0) goto LAB_002c6f34;
      puVar18 = (uint *)ut->q;
      uVar4 = *puVar18;
      if (((int)uVar4 < (int)uVar3) && (uVar12 = puVar18[1], (int)uVar3 <= (int)uVar12))
      goto LAB_002c6a76;
    }
    else {
      puVar18 = (uint *)ut->q;
      uVar4 = *puVar18;
    }
    if (((int)uVar4 < (int)uVar3) && (uVar12 = puVar18[1], (int)uVar3 <= (int)uVar12))
    goto LAB_002c6a76;
    if (uVar3 != 0) {
      if ((ut->chunkNativeStart < local_48) && (local_48 <= ut->chunkNativeLimit)) {
        pvVar8 = ut->p;
        iVar10 = (uint)*(byte *)((long)pvVar8 +
                                ((long)(int)uVar3 - (long)*(int *)((long)pvVar8 + 0x14)) + 0x84) -
                 *(int *)((long)pvVar8 + 8);
        ut->chunkOffset = iVar10;
        return iVar10 != 0;
      }
      if ((uVar3 != local_8c) && ((char)local_78[local_48] < -0x40)) {
        uVar3 = utf8_back1SafeBody_63(local_78,0,uVar3);
        uVar20 = (ulong)uVar3;
        puVar18 = (uint *)ut->q;
      }
      ut->q = ut->p;
      ut->p = puVar18;
      local_80 = puVar18 + 6;
      uVar3 = (int)uVar20 - 0x65;
      *(undefined1 *)((long)puVar18 + 0x82) = 0x65;
      *(undefined1 *)((long)puVar18 + 0xe9) = 0x22;
      uVar6 = 0x22;
      puVar16 = local_78;
      puVar17 = puVar18;
      uVar9 = uVar20;
      uVar5 = 0x22;
      local_88 = puVar18;
      local_58 = uVar20;
      while( true ) {
        uVar4 = (uint)uVar5;
        uVar12 = (uint)uVar20;
        if ((((int)uVar4 < 3) || ((int)uVar12 < 1)) || ((int)(uVar12 - uVar3) < 6)) break;
        uVar12 = uVar12 - 1;
        uVar21 = uVar4 - 1;
        bVar11 = puVar16[uVar12];
        uVar20 = (ulong)uVar21;
        cVar19 = (char)uVar3;
        if ((char)bVar11 < '\0') {
          local_90 = uVar12;
          uVar2 = utf8_prevCharSafeBody_63(puVar16,0,(int32_t *)&local_90,(uint)bVar11,-3);
          if (0xffff < (int)uVar2) {
            *(ushort *)((long)local_88 + uVar20 * 2 + 0x18) = (ushort)uVar2 & 0x3ff | 0xdc00;
            *(char *)((long)local_88 + uVar20 + 0x60) = (char)local_90 - cVar19;
            uVar2 = (uVar2 >> 10) - 0x2840;
            uVar21 = uVar4 - 2;
          }
          uVar6 = (ulong)uVar21;
          *(short *)((long)local_88 + uVar6 * 2 + 0x18) = (short)uVar2;
          *(char *)((long)local_88 + uVar6 + 0x60) = (char)local_90 - cVar19;
          uVar7 = (ulong)uVar12;
          do {
            *(char *)((long)puVar18 + uVar7 + (0x84 - (long)(int)uVar3)) = (char)uVar21;
            uVar20 = (ulong)(int)local_90;
            bVar22 = (long)uVar20 < (long)uVar7;
            uVar7 = uVar7 - 1;
            puVar16 = local_78;
            puVar17 = local_88;
            uVar9 = local_58;
            uVar5 = uVar6;
          } while (bVar22);
        }
        else {
          *(short *)((long)puVar17 + uVar20 * 2 + 0x18) = (short)(char)bVar11;
          *(char *)((long)puVar17 + (long)(int)(uVar12 - uVar3) + 0x84) = (char)uVar21;
          *(char *)((long)puVar17 + uVar20 + 0x60) = (char)uVar12 - cVar19;
          uVar20 = (ulong)uVar12;
          uVar5 = (ulong)uVar21;
        }
      }
      *puVar17 = uVar12;
      puVar17[1] = (uint)uVar9;
      puVar17[2] = uVar4;
      puVar17[3] = 0x22;
      uVar21 = (int)uVar6 - uVar4;
      puVar17[4] = uVar21;
      puVar17[5] = uVar3;
      local_70->chunkContents = (UChar *)((long)local_80 + (long)(int)uVar4 * 2);
      local_70->chunkLength = 0x22 - uVar4;
      local_70->chunkOffset = 0x22 - uVar4;
      local_70->chunkNativeStart = (long)(int)uVar12;
      local_70->chunkNativeLimit = (long)(int)(uint)uVar9;
      local_70->nativeIndexingLimit = uVar21;
      return '\x01';
    }
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
LAB_002c6e4b:
      *puVar18 = uVar3;
      puVar18[1] = uVar3;
      puVar18[2] = 0;
      puVar18[3] = 0;
      puVar18[4] = 0;
      puVar18[5] = uVar3;
      *(undefined1 *)(puVar18 + 0x18) = 0;
      *(undefined1 *)(puVar18 + 0x21) = 0;
      puVar18 = (uint *)ut->q;
      uVar4 = *puVar18;
    }
  }
  else {
    lVar15 = ut->chunkNativeLimit;
    if (lVar15 == local_48) {
      if (uVar3 == local_8c) goto LAB_002c68cc;
      puVar18 = (uint *)ut->q;
      uVar4 = *puVar18;
      if (((int)uVar4 <= (int)uVar3) && (uVar12 = puVar18[1], (int)uVar3 < (int)uVar12))
      goto LAB_002c6a76;
    }
    else {
      puVar18 = (uint *)ut->q;
      uVar4 = *puVar18;
    }
    if (((int)uVar4 <= (int)uVar3) && (uVar12 = puVar18[1], (int)uVar3 < (int)uVar12)) {
LAB_002c6a76:
      ut->q = ut->p;
      ut->p = puVar18;
      uVar21 = puVar18[2];
      ut->chunkContents = (UChar *)((long)puVar18 + (long)(int)uVar21 * 2 + 0x18);
      ut->chunkLength = puVar18[3] - uVar21;
      ut->chunkNativeStart = (long)(int)uVar4;
      ut->chunkNativeLimit = (long)(int)uVar12;
      ut->nativeIndexingLimit = puVar18[4];
      ut->chunkOffset =
           *(byte *)((long)puVar18 + ((long)(int)uVar3 - (long)(int)puVar18[5]) + 0x84) - uVar21;
      return '\x01';
    }
    if (uVar3 != local_8c) {
      if ((local_48 < lVar15) && (ut->chunkNativeStart <= local_48)) {
        pvVar8 = ut->p;
        ut->chunkOffset =
             (uint)*(byte *)((long)pvVar8 +
                            ((long)(int)uVar3 - (long)*(int *)((long)pvVar8 + 0x14)) + 0x84) -
             *(int *)((long)pvVar8 + 8);
        return '\x01';
      }
      if ((char)local_78[local_48] < -0x40) {
        uVar3 = utf8_back1SafeBody_63(local_78,0,uVar3);
        uVar20 = (ulong)uVar3;
        puVar18 = (uint *)ut->q;
        local_8c = ut->b;
        local_48 = (long)(int)uVar3;
      }
      ut->q = ut->p;
      ut->p = puVar18;
      uVar3 = 0x7fffffff;
      if (local_8c < 0x7fffffff) {
        uVar3 = local_8c;
      }
      local_68 = (UChar *)(puVar18 + 6);
      local_38 = puVar18 + 0x18;
      pvVar8 = (void *)((long)puVar18 + (0x84 - local_48));
      local_60 = 0;
      uVar9 = uVar20;
      puVar16 = local_78;
      uVar4 = 0;
      local_88 = puVar18;
      local_4c = uVar3;
      local_40 = pvVar8;
      do {
        uVar21 = (uint)uVar9;
        lVar15 = (long)(int)uVar21;
        uVar1 = puVar16[lVar15];
        uVar12 = (uint)(char)uVar1;
        uVar2 = (uint)uVar20;
        if ((char)uVar1 < '\x01') {
          if ((char)local_60 == '\0') {
            puVar18[4] = uVar4;
            uVar12 = (uint)puVar16[lVar15];
            local_60 = CONCAT71((int7)((ulong)pvVar8 >> 8),1);
          }
          uVar14 = uVar21 + 1;
          bVar11 = (byte)uVar12;
          uVar13 = uVar12 & 0xff;
          local_58 = CONCAT44(local_58._4_4_,uVar14);
          if ((char)bVar11 < '\0') {
            uVar9 = 0xfffd;
            if (uVar14 == uVar3) {
LAB_002c6c5a:
              uVar5 = (ulong)uVar3;
            }
            else {
              if (bVar11 < 0xe0) {
                if (0xc1 < bVar11) {
                  uVar12 = uVar12 & 0x1f;
LAB_002c6cf6:
                  uVar5 = (ulong)uVar14;
                  if ((byte)(puVar16[(int)uVar14] ^ 0x80) < 0x40) {
                    uVar13 = uVar12 << 6 | puVar16[(int)uVar14] ^ 0x80;
                    uVar14 = uVar14 + 1;
                    goto LAB_002c6c32;
                  }
                  goto LAB_002c6d67;
                }
              }
              else if (bVar11 < 0xf0) {
                uVar12 = uVar12 & 0xf;
                if (((byte)" 000000000000\x1000"[uVar12] >> (puVar16[(int)uVar14] >> 5) & 1) != 0) {
                  bVar11 = puVar16[(int)uVar14] & 0x3f;
                  uVar5 = (ulong)uVar14;
LAB_002c6cd3:
                  uVar14 = (int)uVar5 + 1;
                  if (uVar14 != uVar3) {
                    uVar12 = (uint)bVar11 | uVar12 << 6;
                    goto LAB_002c6cf6;
                  }
                  goto LAB_002c6c5a;
                }
              }
              else if (bVar11 < 0xf5) {
                if (((uint)(int)""[puVar16[(int)uVar14] >> 4] >> (uVar13 - 0xf0 & 0x1f) & 1) != 0) {
                  uVar5 = lVar15 + 2;
                  if ((uint)uVar5 == uVar3) goto LAB_002c6c5a;
                  bVar11 = puVar16[uVar5] + 0x80;
                  if (bVar11 < 0x40) {
                    uVar12 = puVar16[(int)uVar14] & 0x3f | (uVar13 - 0xf0) * 0x40;
                    goto LAB_002c6cd3;
                  }
                  goto LAB_002c6d67;
                }
              }
              uVar5 = (ulong)uVar14;
            }
LAB_002c6d67:
            uVar14 = (uint)uVar5;
            uVar12 = uVar4 + 1;
            local_68[(int)uVar4] = (UChar)uVar9;
            local_80 = (uint *)CONCAT44(local_80._4_4_,
                                        (int)CONCAT71((int7)(uVar9 >> 8),(int)uVar9 == 0));
          }
          else {
LAB_002c6c32:
            uVar5 = (ulong)uVar14;
            if (((int)local_8c < 0) && (uVar13 == 0)) {
              uVar14 = uVar14 - 1;
              cVar19 = '\x01';
              bVar22 = false;
              goto LAB_002c6dff;
            }
            if (uVar13 < 0x10000) {
              uVar9 = (ulong)uVar13;
              goto LAB_002c6d67;
            }
            local_68[(int)uVar4] = (short)(uVar13 >> 10) + L'ퟀ';
            uVar12 = uVar4 + 2;
            local_68[(long)(int)uVar4 + 1] = (ushort)uVar13 & 0x3ff | 0xdc00;
            local_80 = (uint *)((ulong)local_80._4_4_ << 0x20);
          }
          uVar3 = uVar4 + 1;
          if ((int)(uVar4 + 1) < (int)uVar12) {
            uVar3 = uVar12;
          }
          memset((void *)((long)(int)uVar4 + (long)local_38),uVar21 - uVar2,
                 (ulong)(~uVar4 + uVar3) + 1);
          uVar3 = (uint)local_58;
          if ((int)(uint)local_58 < (int)uVar14) {
            uVar3 = uVar14;
          }
          pvVar8 = memset((void *)(lVar15 + (long)local_40),uVar4,(ulong)(~uVar21 + uVar3) + 1);
          cVar19 = (char)local_80;
          puVar16 = local_78;
          puVar18 = local_88;
          uVar3 = local_4c;
        }
        else {
          *(short *)((long)puVar18 + (long)(int)uVar4 * 2 + 0x18) = (short)(char)uVar1;
          *(char *)((long)puVar18 + (long)(int)uVar4 + 0x60) = (char)(uVar21 - uVar2);
          pvVar8 = (void *)(long)(int)(uVar21 - uVar2);
          *(char *)((long)(puVar18 + 0x21) + (long)pvVar8) = (char)uVar4;
          uVar14 = uVar21 + 1;
          uVar12 = uVar4 + 1;
          cVar19 = '\0';
        }
        uVar9 = (ulong)uVar14;
        uVar4 = uVar12;
      } while (((int)uVar14 < (int)uVar3) && ((int)uVar12 < 0x20));
      bVar22 = (char)local_60 == '\0';
LAB_002c6dff:
      *(char *)((long)puVar18 + (long)(int)uVar4 + 0x60) = (char)(uVar14 - uVar2);
      *(char *)((long)puVar18 + (long)(int)(uVar14 - uVar2) + 0x84) = (char)uVar4;
      *puVar18 = uVar2;
      puVar18[1] = uVar14;
      puVar18[2] = 0;
      puVar18[3] = uVar4;
      if (bVar22) {
        puVar18[4] = uVar4;
        uVar3 = uVar4;
      }
      else {
        uVar3 = puVar18[4];
      }
      puVar18[5] = uVar2;
      local_70->chunkOffset = 0;
      local_70->chunkContents = local_68;
      local_70->chunkLength = uVar4;
      local_70->chunkNativeStart = local_48;
      local_70->chunkNativeLimit = (long)(int)uVar14;
      local_70->nativeIndexingLimit = uVar3;
      if (-1 < (int)local_8c) {
        return '\x01';
      }
      if ((int)uVar14 <= local_70->c) {
        return '\x01';
      }
      local_70->c = uVar14;
      if (cVar19 != '\0') {
        local_70->b = uVar14;
        *(byte *)&local_70->providerProperties = (byte)local_70->providerProperties & 0xfd;
        return '\x01';
      }
      return '\x01';
    }
    if (lVar15 == local_48) {
LAB_002c68cc:
      ut->chunkOffset = ut->chunkLength;
      return '\0';
    }
    if (uVar3 != puVar18[1]) goto LAB_002c6e4b;
  }
  ut->q = ut->p;
  ut->p = puVar18;
  uVar12 = puVar18[2];
  ut->chunkContents = (UChar *)((long)puVar18 + (long)(int)uVar12 * 2 + 0x18);
  iVar10 = puVar18[3] - uVar12;
  ut->chunkLength = iVar10;
  ut->chunkNativeStart = (long)(int)uVar4;
  uVar4 = puVar18[1];
  ut->chunkNativeLimit = (long)(int)uVar4;
  ut->nativeIndexingLimit = puVar18[4];
  if (uVar3 == uVar4) {
    ut->chunkOffset = iVar10;
    return '\0';
  }
LAB_002c6f34:
  ut->chunkOffset = 0;
  return '\0';
}

Assistant:

static UBool U_CALLCONV
utf8TextAccess(UText *ut, int64_t index, UBool forward) {
    //
    //  Apologies to those who are allergic to goto statements.
    //    Consider each goto to a labelled block to be the equivalent of
    //         call the named block as if it were a function();
    //         return;
    //
    const uint8_t *s8=(const uint8_t *)ut->context;
    UTF8Buf *u8b = NULL;
    int32_t  length = ut->b;         // Length of original utf-8
    int32_t  ix= (int32_t)index;     // Requested index, trimmed to 32 bits.
    int32_t  mapIndex = 0;
    if (index<0) {
        ix=0;
    } else if (index > 0x7fffffff) {
        // Strings with 64 bit lengths not supported by this UTF-8 provider.
        ix = 0x7fffffff;
    }

    // Pin requested index to the string length.
    if (ix>length) {
        if (length>=0) {
            ix=length;
        } else if (ix>=ut->c) {
            // Zero terminated string, and requested index is beyond
            //   the region that has already been scanned.
            //   Scan up to either the end of the string or to the
            //   requested position, whichever comes first.
            while (ut->c<ix && s8[ut->c]!=0) {
                ut->c++;
            }
            //  TODO:  support for null terminated string length > 32 bits.
            if (s8[ut->c] == 0) {
                // We just found the actual length of the string.
                //  Trim the requested index back to that.
                ix     = ut->c;
                ut->b  = ut->c;
                length = ut->c;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
    }

    //
    // Dispatch to the appropriate action for a forward iteration request.
    //
    if (forward) {
        if (ix==ut->chunkNativeLimit) {
            // Check for normal sequential iteration cases first.
            if (ix==length) {
                // Just reached end of string
                // Don't swap buffers, but do set the
                //   current buffer position.
                ut->chunkOffset = ut->chunkLength;
                return FALSE;
            } else {
                // End of current buffer.
                //   check whether other buffer already has what we need.
                UTF8Buf *altB = (UTF8Buf *)ut->q;
                if (ix>=altB->bufNativeStart && ix<altB->bufNativeLimit) {
                    goto swapBuffers;
                }
            }
        }

        // A random access.  Desired index could be in either or niether buf.
        // For optimizing the order of testing, first check for the index
        //    being in the other buffer.  This will be the case for uses that
        //    move back and forth over a fairly limited range
        {
            u8b = (UTF8Buf *)ut->q;   // the alternate buffer
            if (ix>=u8b->bufNativeStart && ix<u8b->bufNativeLimit) {
                // Requested index is in the other buffer.
                goto swapBuffers;
            }
            if (ix == length) {
                // Requested index is end-of-string.
                //   (this is the case of randomly seeking to the end.
                //    The case of iterating off the end is handled earlier.)
                if (ix == ut->chunkNativeLimit) {
                    // Current buffer extends up to the end of the string.
                    //   Leave it as the current buffer.
                    ut->chunkOffset = ut->chunkLength;
                    return FALSE;
                }
                if (ix == u8b->bufNativeLimit) {
                    // Alternate buffer extends to the end of string.
                    //   Swap it in as the current buffer.
                    goto swapBuffersAndFail;
                }

                // Neither existing buffer extends to the end of the string.
                goto makeStubBuffer;
            }

            if (ix<ut->chunkNativeStart || ix>=ut->chunkNativeLimit) {
                // Requested index is in neither buffer.
                goto fillForward;
            }

            // Requested index is in this buffer.
            u8b = (UTF8Buf *)ut->p;   // the current buffer
            mapIndex = ix - u8b->toUCharsMapStart;
            U_ASSERT(mapIndex < (int32_t)sizeof(UTF8Buf::mapToUChars));
            ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
            return TRUE;

        }
    }


    //
    // Dispatch to the appropriate action for a
    //   Backwards Diretion iteration request.
    //
    if (ix==ut->chunkNativeStart) {
        // Check for normal sequential iteration cases first.
        if (ix==0) {
            // Just reached the start of string
            // Don't swap buffers, but do set the
            //   current buffer position.
            ut->chunkOffset = 0;
            return FALSE;
        } else {
            // Start of current buffer.
            //   check whether other buffer already has what we need.
            UTF8Buf *altB = (UTF8Buf *)ut->q;
            if (ix>altB->bufNativeStart && ix<=altB->bufNativeLimit) {
                goto swapBuffers;
            }
        }
    }

    // A random access.  Desired index could be in either or niether buf.
    // For optimizing the order of testing,
    //    Most likely case:  in the other buffer.
    //    Second most likely: in neither buffer.
    //    Unlikely, but must work:  in the current buffer.
    u8b = (UTF8Buf *)ut->q;   // the alternate buffer
    if (ix>u8b->bufNativeStart && ix<=u8b->bufNativeLimit) {
        // Requested index is in the other buffer.
        goto swapBuffers;
    }
    // Requested index is start-of-string.
    //   (this is the case of randomly seeking to the start.
    //    The case of iterating off the start is handled earlier.)
    if (ix==0) {
        if (u8b->bufNativeStart==0) {
            // Alternate buffer contains the data for the start string.
            // Make it be the current buffer.
            goto swapBuffersAndFail;
        } else {
            // Request for data before the start of string,
            //   neither buffer is usable.
            //   set up a zero-length buffer.
            goto makeStubBuffer;
        }
    }

    if (ix<=ut->chunkNativeStart || ix>ut->chunkNativeLimit) {
        // Requested index is in neither buffer.
        goto fillReverse;
    }

    // Requested index is in this buffer.
    //   Set the utf16 buffer index.
    u8b = (UTF8Buf *)ut->p;
    mapIndex = ix - u8b->toUCharsMapStart;
    ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
    if (ut->chunkOffset==0) {
        // This occurs when the first character in the text is
        //   a multi-byte UTF-8 char, and the requested index is to
        //   one of the trailing bytes.  Because there is no preceding ,
        //   character, this access fails.  We can't pick up on the
        //   situation sooner because the requested index is not zero.
        return FALSE;
    } else {
        return TRUE;
    }



swapBuffers:
    //  The alternate buffer (ut->q) has the string data that was requested.
    //  Swap the primary and alternate buffers, and set the
    //   chunk index into the new primary buffer.
    {
        u8b   = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b;
        ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
        ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
        ut->chunkNativeStart    = u8b->bufNativeStart;
        ut->chunkNativeLimit    = u8b->bufNativeLimit;
        ut->nativeIndexingLimit = u8b->bufNILimit;

        // Index into the (now current) chunk
        // Use the map to set the chunk index.  It's more trouble than it's worth
        //    to check whether native indexing can be used.
        U_ASSERT(ix>=u8b->bufNativeStart);
        U_ASSERT(ix<=u8b->bufNativeLimit);
        mapIndex = ix - u8b->toUCharsMapStart;
        U_ASSERT(mapIndex>=0);
        U_ASSERT(mapIndex<(int32_t)sizeof(u8b->mapToUChars));
        ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;

        return TRUE;
    }


 swapBuffersAndFail:
    // We got a request for either the start or end of the string,
    //  with iteration continuing in the out-of-bounds direction.
    // The alternate buffer already contains the data up to the
    //  start/end.
    // Swap the buffers, then return failure, indicating that we couldn't
    //  make things correct for continuing the iteration in the requested
    //  direction.  The position & buffer are correct should the
    //  user decide to iterate in the opposite direction.
    u8b   = (UTF8Buf *)ut->q;
    ut->q = ut->p;
    ut->p = u8b;
    ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
    ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
    ut->chunkNativeStart    = u8b->bufNativeStart;
    ut->chunkNativeLimit    = u8b->bufNativeLimit;
    ut->nativeIndexingLimit = u8b->bufNILimit;

    // Index into the (now current) chunk
    //  For this function  (swapBuffersAndFail), the requested index
    //    will always be at either the start or end of the chunk.
    if (ix==u8b->bufNativeLimit) {
        ut->chunkOffset = ut->chunkLength;
    } else  {
        ut->chunkOffset = 0;
        U_ASSERT(ix == u8b->bufNativeStart);
    }
    return FALSE;

makeStubBuffer:
    //   The user has done a seek/access past the start or end
    //   of the string.  Rather than loading data that is likely
    //   to never be used, just set up a zero-length buffer at
    //   the position.
    u8b = (UTF8Buf *)ut->q;
    u8b->bufNativeStart   = ix;
    u8b->bufNativeLimit   = ix;
    u8b->bufStartIdx      = 0;
    u8b->bufLimitIdx      = 0;
    u8b->bufNILimit       = 0;
    u8b->toUCharsMapStart = ix;
    u8b->mapToNative[0]   = 0;
    u8b->mapToUChars[0]   = 0;
    goto swapBuffersAndFail;



fillForward:
    {
        // Move the incoming index to a code point boundary.
        U8_SET_CP_START(s8, 0, ix);

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        int32_t strLen = ut->b;
        UBool   nulTerminated = FALSE;
        if (strLen < 0) {
            strLen = 0x7fffffff;
            nulTerminated = TRUE;
        }

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative  = u8b_swap->mapToNative;
        uint8_t *mapToUChars  = u8b_swap->mapToUChars;
        int32_t  destIx       = 0;
        int32_t  srcIx        = ix;
        UBool    seenNonAscii = FALSE;
        UChar32  c = 0;

        // Fill the chunk buffer and mapping arrays.
        while (destIx<UTF8_TEXT_CHUNK_SIZE) {
            c = s8[srcIx];
            if (c>0 && c<0x80) {
                // Special case ASCII range for speed.
                //   zero is excluded to simplify bounds checking.
                buf[destIx] = (UChar)c;
                mapToNative[destIx]    = (uint8_t)(srcIx - ix);
                mapToUChars[srcIx-ix]  = (uint8_t)destIx;
                srcIx++;
                destIx++;
            } else {
                // General case, handle everything.
                if (seenNonAscii == FALSE) {
                    seenNonAscii = TRUE;
                    u8b_swap->bufNILimit = destIx;
                }

                int32_t  cIx      = srcIx;
                int32_t  dIx      = destIx;
                int32_t  dIxSaved = destIx;
                U8_NEXT_OR_FFFD(s8, srcIx, strLen, c);
                if (c==0 && nulTerminated) {
                    srcIx--;
                    break;
                }

                U16_APPEND_UNSAFE(buf, destIx, c);
                do {
                    mapToNative[dIx++] = (uint8_t)(cIx - ix);
                } while (dIx < destIx);

                do {
                    mapToUChars[cIx++ - ix] = (uint8_t)dIxSaved;
                } while (cIx < srcIx);
            }
            if (srcIx>=strLen) {
                break;
            }

        }

        //  store Native <--> Chunk Map entries for the end of the buffer.
        //    There is no actual character here, but the index position is valid.
        mapToNative[destIx]     = (uint8_t)(srcIx - ix);
        mapToUChars[srcIx - ix] = (uint8_t)destIx;

        //  fill in Buffer descriptor
        u8b_swap->bufNativeStart     = ix;
        u8b_swap->bufNativeLimit     = srcIx;
        u8b_swap->bufStartIdx        = 0;
        u8b_swap->bufLimitIdx        = destIx;
        if (seenNonAscii == FALSE) {
            u8b_swap->bufNILimit     = destIx;
        }
        u8b_swap->toUCharsMapStart   = u8b_swap->bufNativeStart;

        // Set UText chunk to refer to this buffer.
        ut->chunkContents       = buf;
        ut->chunkOffset         = 0;
        ut->chunkLength         = u8b_swap->bufLimitIdx;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;

        // For zero terminated strings, keep track of the maximum point
        //   scanned so far.
        if (nulTerminated && srcIx>ut->c) {
            ut->c = srcIx;
            if (c==0) {
                // We scanned to the end.
                //   Remember the actual length.
                ut->b = srcIx;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
        return TRUE;
    }


fillReverse:
    {
        // Move the incoming index to a code point boundary.
        // Can only do this if the incoming index is somewhere in the interior of the string.
        //   If index is at the end, there is no character there to look at.
        if (ix != ut->b) {
            // Note: this function will only move the index back if it is on a trail byte
            //       and there is a preceding lead byte and the sequence from the lead 
            //       through this trail could be part of a valid UTF-8 sequence
            //       Otherwise the index remains unchanged.
            U8_SET_CP_START(s8, 0, ix);
        }

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative = u8b_swap->mapToNative;
        uint8_t *mapToUChars = u8b_swap->mapToUChars;
        int32_t  toUCharsMapStart = ix - sizeof(UTF8Buf::mapToUChars) + 1;
        // Note that toUCharsMapStart can be negative. Happens when the remaining
        // text from current position to the beginning is less than the buffer size.
        // + 1 because mapToUChars must have a slot at the end for the bufNativeLimit entry.
        int32_t  destIx = UTF8_TEXT_CHUNK_SIZE+2;   // Start in the overflow region
                                                    //   at end of buffer to leave room
                                                    //   for a surrogate pair at the
                                                    //   buffer start.
        int32_t  srcIx  = ix;
        int32_t  bufNILimit = destIx;
        UChar32   c;

        // Map to/from Native Indexes, fill in for the position at the end of
        //   the buffer.
        //
        mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
        mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;

        // Fill the chunk buffer
        // Work backwards, filling from the end of the buffer towards the front.
        //
        while (destIx>2 && (srcIx - toUCharsMapStart > 5) && (srcIx > 0)) {
            srcIx--;
            destIx--;

            // Get last byte of the UTF-8 character
            c = s8[srcIx];
            if (c<0x80) {
                // Special case ASCII range for speed.
                buf[destIx] = (UChar)c;
                U_ASSERT(toUCharsMapStart <= srcIx);
                mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;
                mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
            } else {
                // General case, handle everything non-ASCII.

                int32_t  sIx      = srcIx;  // ix of last byte of multi-byte u8 char

                // Get the full character from the UTF8 string.
                //   use code derived from tbe macros in utf8.h
                //   Leaves srcIx pointing at the first byte of the UTF-8 char.
                //
                c=utf8_prevCharSafeBody(s8, 0, &srcIx, c, -3);
                // leaves srcIx at first byte of the multi-byte char.

                // Store the character in UTF-16 buffer.
                if (c<0x10000) {
                    buf[destIx] = (UChar)c;
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                } else {
                    buf[destIx]         = U16_TRAIL(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                    buf[--destIx]       = U16_LEAD(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                }

                // Fill in the map from native indexes to UChars buf index.
                do {
                    mapToUChars[sIx-- - toUCharsMapStart] = (uint8_t)destIx;
                } while (sIx >= srcIx);
                U_ASSERT(toUCharsMapStart <= (srcIx+1));

                // Set native indexing limit to be the current position.
                //   We are processing a non-ascii, non-native-indexing char now;
                //     the limit will be here if the rest of the chars to be
                //     added to this buffer are ascii.
                bufNILimit = destIx;
            }
        }
        u8b_swap->bufNativeStart     = srcIx;
        u8b_swap->bufNativeLimit     = ix;
        u8b_swap->bufStartIdx        = destIx;
        u8b_swap->bufLimitIdx        = UTF8_TEXT_CHUNK_SIZE+2;
        u8b_swap->bufNILimit         = bufNILimit - u8b_swap->bufStartIdx;
        u8b_swap->toUCharsMapStart   = toUCharsMapStart;

        ut->chunkContents       = &buf[u8b_swap->bufStartIdx];
        ut->chunkLength         = u8b_swap->bufLimitIdx - u8b_swap->bufStartIdx;
        ut->chunkOffset         = ut->chunkLength;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;
        return TRUE;
    }

}